

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_node_by_path_internal(fy_node *fyn,char *path,size_t pathlen,fy_node_walk_flags flags)

{
  fy_token *pfVar1;
  long lVar2;
  char *key;
  ushort **ppuVar3;
  void *pvVar4;
  fy_node_pair *pfVar5;
  fy_node *fyn_00;
  fy_node *pfVar6;
  char cVar7;
  fy_node_walk_flags fVar8;
  void **ppvVar9;
  void **ppvVar10;
  void **ppvVar11;
  size_t sVar12;
  size_t sVar13;
  fy_token *fyn_01;
  char *pcVar14;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar15;
  char *pcVar16;
  int iVar17;
  undefined8 unaff_R15;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  void *local_68;
  char *local_60;
  char *end_idx;
  int local_4c;
  fy_node *pfStack_48;
  int code_length;
  char *local_40;
  uint local_38;
  fy_node_walk_flags local_34;
  
  ppvVar9 = &local_68;
  ppvVar10 = &local_68;
  if (path == (char *)0x0 || fyn == (fy_node *)0x0) {
    return (fy_node *)0x0;
  }
  if (pathlen == 0xffffffffffffffff) {
    pathlen = strlen(path);
  }
  fVar8 = flags & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON);
  pcVar19 = path + pathlen;
  if (pathlen == 0) {
    uVar18 = 0;
  }
  else {
    uVar18 = CONCAT71((int7)((ulong)unaff_R15 >> 8),pcVar19[-1] == '/');
  }
  if (fVar8 == FYNWF_PTR_JSON) {
    if (pathlen == 0) {
      return fyn;
    }
    if (*path != '/') {
      return (fy_node *)0x0;
    }
    key = path + 1;
  }
  else {
    key = path;
    if (fVar8 != FYNWF_PTR_RELJSON) {
      bVar21 = path < pcVar19;
      ppvVar11 = &local_68;
      if (pcVar19 <= path) goto LAB_001220cc;
      if (*path == '/') {
        do {
          pathlen = pathlen - 1;
          ppvVar11 = &local_68;
          key = pcVar19;
          if (pathlen == 0) goto LAB_001220cc;
          path = path + 1;
        } while (*path == '/');
        bVar21 = path < pcVar19;
        key = path;
      }
      ppvVar11 = &local_68;
      if (!bVar21) goto LAB_001220cc;
    }
  }
  local_40 = pcVar19;
  pfVar6 = fy_node_follow_aliases(fyn,flags,true);
  pcVar19 = local_40;
  if (pfVar6 == (fy_node *)0x0) {
    fyn = (fy_node *)0x0;
    ppvVar11 = &local_68;
    goto LAB_001220cc;
  }
  if ((pfVar6->field_0x34 & 3) == 0) {
    fyn = (fy_node *)0x0;
    ppvVar11 = &local_68;
    goto LAB_001220cc;
  }
  if (pfVar6 == (fy_node *)0x0) {
LAB_00122252:
    __assert_fail("fy_node_is_mapping(fyn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                  ,0xe9f,
                  "struct fy_node *fy_node_by_path_internal(struct fy_node *, const char *, size_t, enum fy_node_walk_flags)"
                 );
  }
  local_38 = (uint)uVar18;
  if ((pfVar6->field_0x34 & 3) == 1) {
    if ((fVar8 == FYNWF_PTR_JSON) || (fVar8 == FYNWF_PTR_RELJSON)) {
      if (*key == '-') {
        return (fy_node *)0x0;
      }
      pfStack_48 = pfVar6;
      lVar2 = strtol(key,&local_60,10);
      iVar17 = (int)lVar2;
      if (iVar17 < 0) {
        return (fy_node *)0x0;
      }
      if (iVar17 == 0 && local_60 == key) {
        return (fy_node *)0x0;
      }
      key = local_60;
      if (local_60 < local_40) {
        key = local_60 + (*local_60 == '/');
      }
    }
    else {
      pfStack_48 = pfVar6;
      if (key < local_40) {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)*key * 2 + 1) & 0x20) == 0) break;
          key = key + 1;
        } while (key < local_40);
      }
      cVar7 = *key;
      if ((long)cVar7 == 0x5b) {
        key = key + 1;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if ((cVar7 != '-') && (((*ppuVar3)[cVar7] & 0x800) == 0)) {
          return (fy_node *)0x0;
        }
      }
      lVar2 = strtol(key,&local_60,10);
      iVar17 = (int)lVar2;
      if (iVar17 == 0 && local_60 == key) {
        return (fy_node *)0x0;
      }
      key = local_60;
      if (local_60 < local_40) {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)*key * 2 + 1) & 0x20) == 0) break;
          key = key + 1;
        } while (key < local_40);
      }
      if (cVar7 == '[') {
        if (*key != ']') {
          return (fy_node *)0x0;
        }
        key = key + 1;
      }
      if (key < local_40) {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)*key * 2 + 1) & 0x20) == 0) break;
          key = key + 1;
        } while (key < local_40);
      }
    }
    sVar13 = (long)local_40 - (long)key;
    pfVar6 = fy_node_sequence_get_by_index(pfStack_48,iVar17);
    uVar18 = (ulong)local_38;
    if ((char)local_38 != '\0') {
      pfVar6 = fy_node_follow_aliases(pfVar6,flags,false);
    }
    fyn = fy_node_by_path_internal(pfVar6,key,sVar13,flags);
    ppvVar11 = &local_68;
    pcVar19 = local_40;
    goto LAB_001220cc;
  }
  if ((pfVar6 == (fy_node *)0x0) || ((pfVar6->field_0x34 & 3) != 2)) goto LAB_00122252;
  pcVar14 = key;
  local_34 = flags;
  if ((fVar8 == FYNWF_PTR_JSON) || (fVar8 == FYNWF_PTR_RELJSON)) {
    bVar21 = false;
    while ((pcVar14 < local_40 && (cVar7 = *pcVar14, cVar7 != '/'))) {
      pcVar14 = pcVar14 + 1;
      if (cVar7 == '~') {
        bVar21 = true;
      }
    }
    sVar13 = (long)pcVar14 - (long)key;
    if (bVar21) {
      ppvVar9 = (void **)((long)&local_68 - (sVar13 + 0x10 & 0xfffffffffffffff0));
      pcVar19 = (char *)ppvVar9;
      while (key < pcVar14) {
        pcVar16 = key + 1;
        if (*key == '~') {
          if (pcVar14 <= pcVar16) {
            return (fy_node *)0x0;
          }
          cVar7 = '/';
          if (key[1] == '0') {
            cVar7 = '~';
          }
          *pcVar19 = cVar7;
          pcVar16 = key + 2;
        }
        else {
          *pcVar19 = *key;
        }
        pcVar19 = pcVar19 + 1;
        key = pcVar16;
      }
      sVar13 = (long)pcVar19 - (long)ppvVar9;
      key = (char *)ppvVar9;
    }
    if ((local_34 >> 0x12 & 1) != 0) {
      pfStack_48 = pfVar6;
      *(char *)((long)ppvVar9 + -8) = -0x7b;
      *(char *)((long)ppvVar9 + -7) = '\x1f';
      *(char *)((long)ppvVar9 + -6) = '\x12';
      *(char *)((long)ppvVar9 + -5) = '\0';
      *(char *)((long)ppvVar9 + -4) = '\0';
      *(char *)((long)ppvVar9 + -3) = '\0';
      *(char *)((long)ppvVar9 + -2) = '\0';
      *(char *)((long)ppvVar9 + -1) = '\0';
      pvVar4 = memchr(key,0x25,sVar13);
      pfVar6 = pfStack_48;
      if (pvVar4 != (void *)0x0) {
        lVar2 = -(sVar13 + 0x10 & 0xfffffffffffffff0);
        pcVar16 = (char *)((long)ppvVar9 + lVar2);
        pcVar19 = pcVar16;
        end_idx = pcVar16;
        if (0 < (long)sVar13) {
          pcVar20 = key + sVar13;
          do {
            pcVar16[-8] = -0x3a;
            pcVar16[-7] = '\x1f';
            pcVar16[-6] = '\x12';
            pcVar16[-5] = '\0';
            pcVar16[-4] = '\0';
            pcVar16[-3] = '\0';
            pcVar16[-2] = '\0';
            pcVar16[-1] = '\0';
            local_68 = memchr(key,0x25,(long)pcVar20 - (long)key);
            iVar17 = (int)local_68;
            if (local_68 == (void *)0x0) {
              iVar17 = (int)pcVar20;
            }
            sVar12 = (size_t)(iVar17 - (int)key);
            pcVar16[-8] = -0x1a;
            pcVar16[-7] = '\x1f';
            pcVar16[-6] = '\x12';
            pcVar16[-5] = '\0';
            pcVar16[-4] = '\0';
            pcVar16[-3] = '\0';
            pcVar16[-2] = '\0';
            pcVar16[-1] = '\0';
            memcpy(pcVar19,key,sVar12);
            pcVar19 = pcVar19 + sVar12;
            if (local_68 == (void *)0x0) break;
            local_4c = 4;
            builtin_strncpy((char *)((long)ppvVar9 + lVar2 + -8),"\x13 \x12",4);
            pcVar16[-4] = '\0';
            pcVar16[-3] = '\0';
            pcVar16[-2] = '\0';
            pcVar16[-1] = '\0';
            key = fy_uri_esc(key + sVar12,(long)pcVar20 - (long)(key + sVar12),(uint8_t *)&local_60,
                             &local_4c);
            if (key == (char *)0x0) {
              return (fy_node *)0x0;
            }
            sVar12 = (size_t)local_4c;
            builtin_strncpy((char *)((long)ppvVar9 + lVar2 + -8),"- \x12",4);
            pcVar16[-4] = '\0';
            pcVar16[-3] = '\0';
            pcVar16[-2] = '\0';
            pcVar16[-1] = '\0';
            memcpy(pcVar19,&local_60,sVar12);
            pcVar19 = pcVar19 + sVar12;
          } while (key < pcVar20);
        }
        sVar13 = (long)pcVar19 - (long)end_idx;
        ppvVar9 = (void **)pcVar16;
        key = end_idx;
        pfVar6 = pfStack_48;
      }
    }
    builtin_strncpy((char *)((long)ppvVar9 + -8),"~ \x12",4);
    *(char *)((long)ppvVar9 + -4) = '\0';
    *(char *)((long)ppvVar9 + -3) = '\0';
    *(char *)((long)ppvVar9 + -2) = '\0';
    *(char *)((long)ppvVar9 + -1) = '\0';
    pfVar5 = fy_node_mapping_lookup_pair_by_simple_key(pfVar6,key,sVar13);
    flags = local_34;
    if (pfVar5 == (fy_node_pair *)0x0) {
      fyn_00 = (fy_node *)0x0;
    }
    else {
      fyn_00 = pfVar5->value;
    }
LAB_00122092:
    sVar13 = (long)local_40 - (long)pcVar14;
    if ((sVar13 != 0 & (byte)local_38) == 1) {
      *(undefined8 *)((long)ppvVar9 + -8) = 0x1220b0;
      fyn_00 = fy_node_follow_aliases(fyn_00,flags,true);
    }
    *(undefined8 *)((long)ppvVar9 + -8) = 0x1220c1;
    fyn = fy_node_by_path_internal(fyn_00,pcVar14,sVar13,flags);
    ppvVar10 = ppvVar9;
  }
  else {
    pcVar16 = key;
    if (key < local_40) {
      do {
        cVar7 = *pcVar16;
        pcVar14 = pcVar16;
        if (cVar7 == '/') break;
        pcVar14 = pcVar16 + 1;
        pcVar20 = pcVar14;
        if (cVar7 == '\"') {
          while( true ) {
            pcVar14 = pcVar20;
            if (pcVar19 <= pcVar14) {
              return (fy_node *)0x0;
            }
            if (*pcVar14 == '\"') break;
            pcVar20 = pcVar14 + 1;
            if ((pcVar20 < pcVar19 && *pcVar14 == '\\') && (pcVar14[1] == '\"')) {
              pcVar20 = pcVar14 + 2;
            }
          }
          if (pcVar19 <= pcVar14) {
            return (fy_node *)0x0;
          }
          if (*pcVar14 != '\"') {
            return (fy_node *)0x0;
          }
LAB_00121f24:
          pcVar14 = pcVar14 + 1;
        }
        else if (cVar7 == '\\') {
          if (pcVar19 <= pcVar14) {
            return (fy_node *)0x0;
          }
          pvVar4 = memchr("/*&.{}[]\\",(int)*pcVar14,10);
          if (pvVar4 == (void *)0x0) {
            return (fy_node *)0x0;
          }
          pcVar14 = pcVar16 + 2;
          pcVar19 = local_40;
        }
        else if (cVar7 == '\'') {
          bVar21 = pcVar14 < pcVar19;
          if (!bVar21) {
            return (fy_node *)0x0;
          }
          if (*pcVar14 != '\'') {
            pcVar16 = pcVar16 + 2;
            do {
              pcVar14 = pcVar16;
              bVar21 = pcVar14 < pcVar19;
              if (!bVar21) {
                return (fy_node *)0x0;
              }
              pcVar16 = pcVar14 + 1;
            } while (*pcVar14 != '\'');
          }
          if (!bVar21) {
            return (fy_node *)0x0;
          }
          if (*pcVar14 != '\'') {
            return (fy_node *)0x0;
          }
          goto LAB_00121f24;
        }
        pcVar16 = pcVar14;
      } while (pcVar14 < pcVar19);
    }
    sVar13 = (long)pcVar14 - (long)key;
    fyn_00 = fy_node_mapping_lookup_by_string(pfVar6,key,sVar13);
    flags = local_34;
    ppvVar9 = &local_68;
    if (fyn_00 != (fy_node *)0x0) goto LAB_00122092;
    if ((local_34 & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON|FYNWF_FOLLOW)) != FYNWF_FOLLOW) {
LAB_0012223d:
      fyn_00 = (fy_node *)0x0;
      ppvVar9 = &local_68;
      goto LAB_00122092;
    }
    fyn_00 = fy_node_mapping_lookup_by_string(pfVar6,"<<",2);
    if (fyn_00 != (fy_node *)0x0) {
      if (((fyn_00->field_0x34 & 3) == 0) && (fyn_00->style == FYNS_ALIAS)) {
        pfVar6 = fy_node_follow_aliases(fyn_00,flags,false);
        fyn_00 = fy_node_mapping_lookup_by_string(pfVar6,key,sVar13);
        ppvVar9 = &local_68;
      }
      else {
        if ((fyn_00->field_0x34 & 3) != 1) goto LAB_0012223d;
        paVar15 = &fyn_00->field_12;
        fyn_01 = (fyn_00->field_12).scalar;
        ppvVar9 = &local_68;
        flags = local_34;
        if (fyn_01 != (fy_token *)0x0 && fyn_01 != (fy_token *)paVar15) {
          do {
            if ((((ulong)fyn_01->text0 & 0x300000000) == 0) && (fyn_01->analyze_flags == 7)) {
              pfVar6 = fy_node_follow_aliases((fy_node *)fyn_01,local_34,false);
              fyn_00 = fy_node_mapping_lookup_by_string(pfVar6,key,sVar13);
              ppvVar9 = &local_68;
              flags = local_34;
              if (fyn_00 != (fy_node *)0x0) break;
              fyn_00 = (fy_node *)0x0;
            }
            pfVar1 = (fy_token *)(fyn_01->node).next;
            fyn_01 = (fy_token *)0x0;
            if (pfVar1 != (fy_token *)paVar15) {
              fyn_01 = pfVar1;
            }
            ppvVar9 = &local_68;
            flags = local_34;
          } while (fyn_01 != (fy_token *)0x0);
        }
      }
      goto LAB_00122092;
    }
    fyn = (fy_node *)0x0;
  }
  uVar18 = (ulong)local_38;
  ppvVar11 = ppvVar10;
  pcVar19 = local_40;
  key = pcVar14;
LAB_001220cc:
  if ((pcVar19 != key & (byte)uVar18) == 1) {
    *(undefined8 *)((long)ppvVar11 + -8) = 0x1220e9;
    pfVar6 = fy_node_follow_aliases(fyn,flags,true);
    return pfVar6;
  }
  return fyn;
}

Assistant:

static struct fy_node *
fy_node_by_path_internal(struct fy_node *fyn,
                         const char *path, size_t pathlen,
                         enum fy_node_walk_flags flags) {
    enum fy_node_walk_flags ptr_flags;
    struct fy_node *fynt, *fyni;
    const char *s, *e, *ss, *ee;
    char *end_idx, *json_key, *t, *p, *uri_path;
    char c;
    int idx, rlen;
    size_t len, json_key_len, uri_path_len;
    bool has_json_key_esc;
    uint8_t code[4];
    int code_length;
    bool trailing_slash;

    if (!fyn || !path)
        return NULL;

    ptr_flags = flags & FYNWF_PTR(FYNWF_PTR_MASK);

    s = path;
    if (pathlen == (size_t) -1)
        pathlen = strlen(path);
    e = s + pathlen;

    /* a trailing slash works just like unix and symbolic links
	 * if it does not exist no symbolic link lookups are performed
	 * at the end of the operation.
	 * if it exists they are followed upon resolution
	 */
    trailing_slash = pathlen > 0 && path[pathlen - 1] == '/';

    /* and continue on path lookup with the rest */

    /* skip all prefixed / */
    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:
            while (s < e && *s == '/')
                s++;
            /* for a last component / always match this one */
            if (s >= e)
                goto out;
            break;

        case FYNWF_PTR_JSON:
            /* "" -> everything here */
            if (s == e)
                return fyn;
            /* it must have a separator here */
            if (*s != '/')
                return NULL;
            s++;
            break;

        case FYNWF_PTR_RELJSON:
            break;
    }

    /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
			__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
    fyn = fy_node_follow_aliases(fyn, flags, true);

    /* scalar can't match (it has no key) */
    if (fy_node_is_scalar(fyn)) {
        fyn = NULL;
        goto out;
    }

    /* for a sequence the only allowed key is [n] where n is the index to follow */
    if (fy_node_is_sequence(fyn)) {

        c = -1;
        switch (ptr_flags) {
            default:
            case FYNWF_PTR_YAML:
                while (s < e && isspace(*s))
                    s++;

                c = *s;
                if (c == '[')
                    s++;
                else if (!isdigit(c) && c != '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                s = end_idx;

                while (s < e && isspace(*s))
                    s++;

                if (c == '[' && *s++ != ']')
                    return NULL;

                while (s < e && isspace(*s))
                    s++;

                break;

            case FYNWF_PTR_JSON:
            case FYNWF_PTR_RELJSON:

                /* special array end - always fails */
                if (*s == '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                /* no negatives */
                if (idx < 0)
                    return NULL;

                s = end_idx;

                if (s < e && *s == '/')
                    s++;

                break;
        }

        len = e - s;

        fyn = fy_node_sequence_get_by_index(fyn, idx);
        if (trailing_slash)
            fyn = fy_node_follow_aliases(fyn, flags, false);
        fyn = fy_node_by_path_internal(fyn, s, len, flags);
        goto out;
    }

    /* be a little bit paranoid */
    assert(fy_node_is_mapping(fyn));

    path = s;
    pathlen = (size_t) (e - s);

    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:

            /* scan ahead for the end of the path component
		* note that we don't do UTF8 here, because all the
		* escapes are regular ascii characters, i.e.
		* '/', '*', '&', '.', '{', '}', '[', ']' and '\\'
		*/

            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;

                if (c == '\\') {
                    /* it must be a valid escape */
                    if (s >= e || !strchr("/*&.{}[]\\", *s))
                        return NULL;
                    s++;
                } else if (c == '"') {
                    while (s < e && *s != '"') {
                        c = *s++;
                        if (c == '\\' && (s < e && *s == '"'))
                            s++;
                    }
                    /* not a normal double quote end */
                    if (s >= e || *s != '"')
                        return NULL;
                    s++;
                } else if (c == '\'') {
                    while (s < e && *s != '\'') {
                        c = *s++;
                        if (c == '\'' && (s < e && *s == '\''))
                            s++;
                    }
                    /* not a normal single quote end */
                    if (s >= e || *s != '\'')
                        return NULL;
                    s++;
                }
            }
            len = s - path;

            fynt = fyn;
            fyn = fy_node_mapping_lookup_by_string(fyn, path, len);

            /* failed! last ditch attempt, is there a merge key? */
            if (!fyn && fynt && (flags & FYNWF_FOLLOW) && ptr_flags == FYNWF_PTR_YAML) {
                fyn = fy_node_mapping_lookup_by_string(fynt, "<<", 2);
                if (!fyn)
                    goto out;

                if (fy_node_is_alias(fyn)) {

                    /* single alias '<<: *foo' */
                    fyn = fy_node_mapping_lookup_by_string(
                            fy_node_follow_aliases(fyn, flags, false), path, len);

                } else if (fy_node_is_sequence(fyn)) {

                    /* multi aliases '<<: [ *foo, *bar ]' */
                    fynt = fyn;
                    for (fyni = fy_node_list_head(&fynt->sequence); fyni;
                         fyni = fy_node_next(&fynt->sequence, fyni)) {
                        if (!fy_node_is_alias(fyni))
                            continue;
                        fyn = fy_node_mapping_lookup_by_string(
                                fy_node_follow_aliases(fyni, flags, false),
                                path, len);
                        if (fyn)
                            break;
                    }
                } else
                    fyn = NULL;
            }
            break;

        case FYNWF_PTR_JSON:
        case FYNWF_PTR_RELJSON:

            has_json_key_esc = false;
            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;
                if (c == '~')
                    has_json_key_esc = true;
            }
            len = s - path;

            if (has_json_key_esc) {
                /* note that the escapes reduce the length, so allocating the
			 * same size is guaranteed safe */
                json_key = alloca(len + 1);

                ss = path;
                ee = s;
                t = json_key;
                while (ss < ee) {
                    if (*ss != '~') {
                        *t++ = *ss++;
                        continue;
                    }
                    /* unterminated ~ escape, or neither ~0, ~1 */
                    if (ss + 1 >= ee || (ss[1] < '0' && ss[1] > '1'))
                        return NULL;
                    *t++ = ss[1] == '0' ? '~' : '/';
                    ss += 2;
                }
                json_key_len = t - json_key;

                path = json_key;
                len = json_key_len;
            }

            /* URI encoded escaped */
            if ((flags & FYNWF_URI_ENCODED) && memchr(path, '%', len)) {
                /* escapes shrink, so safe to allocate as much */
                uri_path = alloca(len + 1);

                ss = path;
                ee = path + len;
                t = uri_path;
                while (ss < ee) {
                    /* copy run until '%' or end */
                    p = memchr(ss, '%', ee - ss);
                    rlen = (p ? p : ee) - ss;
                    memcpy(t, ss, rlen);
                    ss += rlen;
                    t += rlen;

                    /* if end, break */
                    if (!p)
                        break;

                    /* collect a utf8 character sequence */
                    code_length = sizeof(code);
                    ss = fy_uri_esc(ss, ee - ss, code, &code_length);
                    if (!ss) {
                        /* bad % escape sequence */
                        return NULL;
                    }
                    memcpy(t, code, code_length);
                    t += code_length;
                }
                uri_path_len = t - uri_path;

                path = uri_path;
                len = uri_path_len;
            }

            fynt = fyn;
            fyn = fy_node_mapping_lookup_value_by_simple_key(fyn, path, len);
            break;
    }

    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    fyn = fy_node_by_path_internal(fyn, s, len, flags);

    out:
    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    return fyn;
}